

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O2

int TestDynamicLoader(char *libname,char *symbol,int r1,int r2,int r3,int flags)

{
  int iVar1;
  ostream *poVar2;
  LibraryHandle lib;
  SymbolPointer p_Var3;
  char *pcVar4;
  allocator<char> local_49;
  string local_48;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Testing: ");
  poVar2 = std::operator<<(poVar2,libname);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,libname,&local_49);
  lib = cmsys::DynamicLoader::OpenLibrary(&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  if ((lib == (LibraryHandle)0x0) == (r1 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,symbol,&local_49);
    p_Var3 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if ((p_Var3 == (SymbolPointer)0x0) == (r2 == 0)) {
      iVar1 = cmsys::DynamicLoader::CloseLibrary(lib);
      if ((r3 == 0) == (iVar1 == 0)) {
        return 0;
      }
      pcVar4 = "CloseLibrary: ";
    }
    else {
      pcVar4 = "GetSymbolAddress: ";
    }
  }
  else {
    pcVar4 = "OpenLibrary: ";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar4);
  pcVar4 = cmsys::DynamicLoader::LastError();
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 1;
}

Assistant:

static int TestDynamicLoader(const char* libname, const char* symbol, int r1,
                             int r2, int r3, int flags = 0)
{
  std::cerr << "Testing: " << libname << std::endl;
  kwsys::DynamicLoader::LibraryHandle l =
    kwsys::DynamicLoader::OpenLibrary(libname, flags);
  // If result is incompatible with expectation just fails (xor):
  if ((r1 && !l) || (!r1 && l)) {
    std::cerr << "OpenLibrary: " << kwsys::DynamicLoader::LastError()
              << std::endl;
    return 1;
  }
  kwsys::DynamicLoader::SymbolPointer f =
    kwsys::DynamicLoader::GetSymbolAddress(l, symbol);
  if ((r2 && !f) || (!r2 && f)) {
    std::cerr << "GetSymbolAddress: " << kwsys::DynamicLoader::LastError()
              << std::endl;
    return 1;
  }
#ifndef __APPLE__
  int s = kwsys::DynamicLoader::CloseLibrary(l);
  if ((r3 && !s) || (!r3 && s)) {
    std::cerr << "CloseLibrary: " << kwsys::DynamicLoader::LastError()
              << std::endl;
    return 1;
  }
#else
  (void)r3;
#endif
  return 0;
}